

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> * __thiscall
wallet::LegacyScriptPubKeyMan::GetKeys
          (set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> *__return_storage_ptr__,
          LegacyScriptPubKeyMan *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock48;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_30._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  iVar2 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[9])
                    ();
  if ((char)iVar2 == '\0') {
    FillableSigningProvider::GetKeys
              (__return_storage_ptr__,&(this->super_LegacyDataSPKM).super_FillableSigningProvider);
  }
  else {
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    for (p_Var3 = (this->super_LegacyDataSPKM).mapCryptedKeys._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var3 !=
        &(this->super_LegacyDataSPKM).mapCryptedKeys._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      std::_Rb_tree<CKeyID,CKeyID,std::_Identity<CKeyID>,std::less<CKeyID>,std::allocator<CKeyID>>::
      _M_insert_unique<CKeyID_const&>
                ((_Rb_tree<CKeyID,CKeyID,std::_Identity<CKeyID>,std::less<CKeyID>,std::allocator<CKeyID>>
                  *)__return_storage_ptr__,(CKeyID *)(p_Var3 + 1));
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::set<CKeyID> LegacyScriptPubKeyMan::GetKeys() const
{
    LOCK(cs_KeyStore);
    if (!m_storage.HasEncryptionKeys()) {
        return FillableSigningProvider::GetKeys();
    }
    std::set<CKeyID> set_address;
    for (const auto& mi : mapCryptedKeys) {
        set_address.insert(mi.first);
    }
    return set_address;
}